

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  Expr *p;
  Expr *pE;
  ExprList_item *pEVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iCol;
  char *local_98;
  int local_8c;
  Parse *local_88;
  NameContext *local_80;
  ExprList *local_78;
  ulong local_70;
  Walker local_68;
  
  if (pOrderBy == (ExprList *)0x0) {
    iVar1 = 0;
  }
  else {
    local_8c = pSelect->pEList->nExpr;
    local_88 = pNC->pParse;
    pEVar2 = pOrderBy->a;
    uVar3 = 0;
    local_98 = zType;
    local_80 = pNC;
    local_78 = pOrderBy;
    while ((int)uVar3 < local_78->nExpr) {
      pExpr = pEVar2->pExpr;
      p = sqlite3ExprSkipCollate(pExpr);
      local_70 = uVar3;
      if ((*local_98 == 'G') ||
         (iCol = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE), iCol < 1)) {
        iVar1 = sqlite3ExprIsInteger(p,&iCol);
        if (iVar1 != 0) {
          if (iCol - 0x10000U < 0xffff0001) {
            resolveOutOfRangeError(local_88,local_98,(int)uVar3 + 1,local_8c);
            return 1;
          }
          goto LAB_0017eced;
        }
        (pEVar2->u).x.iOrderByCol = 0;
        iVar1 = sqlite3ResolveExprNames(local_80,pExpr);
        if (iVar1 != 0) {
          return 1;
        }
        lVar5 = 8;
        for (lVar4 = 0; lVar4 < pSelect->pEList->nExpr; lVar4 = lVar4 + 1) {
          iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                     *(Expr **)((long)pSelect->pEList->a + lVar5 + -8),-1);
          if (iVar1 == 0) {
            local_68.walkerDepth = 0;
            local_68.eCode = '\0';
            local_68._37_3_ = 0;
            local_68.pParse = (Parse *)0x0;
            local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
            local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
            local_68.xExprCallback = resolveRemoveWindowsCb;
            local_68.u.pSelect = pSelect;
            sqlite3WalkExpr(&local_68,pExpr);
            (pEVar2->u).x.iOrderByCol = (short)lVar4 + 1;
          }
          lVar5 = lVar5 + 0x20;
        }
      }
      else {
LAB_0017eced:
        (pEVar2->u).x.iOrderByCol = (u16)iCol;
      }
      pEVar2 = pEVar2 + 1;
      uVar3 = (ulong)((int)local_70 + 1);
    }
    iVar1 = sqlite3ResolveOrderGroupBy(local_88,pSelect,local_78,local_98);
  }
  return iVar1;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expresion is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        resolveRemoveWindows(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}